

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db_archive.cpp
# Opt level: O0

void __thiscall
DbArchiveWriteSpan_WriteUint64Span_Test::DbArchiveWriteSpan_WriteUint64Span_Test
          (DbArchiveWriteSpan_WriteUint64Span_Test *this)

{
  DbArchiveWriteSpan_WriteUint64Span_Test *this_local;
  
  anon_unknown.dwarf_779a0::DbArchiveWriteSpan::DbArchiveWriteSpan(&this->super_DbArchiveWriteSpan);
  (this->super_DbArchiveWriteSpan).super_Test._vptr_Test =
       (_func_int **)&PTR__DbArchiveWriteSpan_WriteUint64Span_Test_003ce8e8;
  return;
}

Assistant:

TEST_F (DbArchiveWriteSpan, WriteUint64Span) {
    using ::testing::_;
    using ::testing::Invoke;

    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    std::array<std::uint64_t, 2> original{{
        UINT64_C (0x0011223344556677),
        UINT64_C (0x8899AABBCCDDEEFF),
    }};
    auto const span = ::pstore::gsl::make_span (original);

    mock_mutex mutex;
    mock_transaction transaction (db, std::unique_lock<mock_mutex>{mutex});
    // All calls to transaction.alloc_rw are forwarded to the real implementation. We
    // expect there to be a single call to alloc_rw() which is suitable for the space
    // and alignment requirement of the entire span.
    auto invoke_base_allocate = Invoke (&transaction, &mock_transaction::base_allocate);
    EXPECT_CALL (transaction, allocate (_, _)).WillRepeatedly (invoke_base_allocate);
    EXPECT_CALL (transaction, allocate (sizeof (original), alignof (std::uint64_t)))
        .Times (1)
        .WillOnce (invoke_base_allocate);

    // Write the span.
    using namespace pstore::serialize;
    write (archive::make_writer (transaction), span);
}